

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# forrest_tomlin.cc
# Opt level: O2

void __thiscall ipx::ForrestTomlin::SolvePermuted(ForrestTomlin *this,Vector *lhs,char trans)

{
  double dVar1;
  int iVar2;
  int iVar3;
  pointer piVar4;
  double *pdVar5;
  long lVar6;
  ulong uVar7;
  ulong uVar8;
  Int k;
  long lVar9;
  int iVar10;
  ulong uVar11;
  double dVar12;
  
  piVar4 = (this->replaced_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  uVar11 = (ulong)((long)(this->replaced_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_finish - (long)piVar4) >> 2;
  uVar7 = 0;
  iVar10 = (int)uVar11;
  if (0 < iVar10) {
    uVar7 = uVar11 & 0xffffffff;
  }
  if ((trans & 0xdfU) == 0x54) {
    pdVar5 = lhs->_M_data;
    iVar2 = this->dim_;
    for (uVar8 = 0; uVar7 != uVar8; uVar8 = uVar8 + 1) {
      iVar3 = piVar4[uVar8];
      pdVar5[(long)iVar2 + uVar8] = pdVar5[iVar3];
      pdVar5[iVar3] = 0.0;
    }
    TriangularSolve(&this->U_,lhs,'t',"upper",0);
    uVar11 = uVar11 & 0xffffffff;
    lVar9 = (long)(iVar10 + -1);
    while (0 < (int)uVar11) {
      uVar11 = uVar11 - 1;
      ScatterColumn(&this->R_,(Int)lVar9,-lhs->_M_data[this->dim_ + lVar9],lhs);
      lVar6 = this->dim_ + lVar9;
      pdVar5 = lhs->_M_data;
      pdVar5[(this->replaced_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start[uVar11 & 0xffffffff]] = pdVar5[lVar6];
      pdVar5[lVar6] = 0.0;
      lVar9 = lVar9 + -1;
    }
    TriangularSolve(&this->L_,lhs,'t',"lower",1);
    return;
  }
  TriangularSolve(&this->L_,lhs,'n',"lower",1);
  for (uVar11 = 0; uVar7 != uVar11; uVar11 = uVar11 + 1) {
    dVar1 = lhs->_M_data
            [(this->replaced_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start[uVar11]];
    dVar12 = DotColumn(&this->R_,(Int)uVar11,lhs);
    pdVar5 = lhs->_M_data;
    pdVar5[(long)this->dim_ + uVar11] = dVar1 - dVar12;
    pdVar5[(this->replaced_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start[uVar11]] = 0.0;
  }
  TriangularSolve(&this->U_,lhs,'n',"upper",0);
  iVar2 = this->dim_;
  pdVar5 = lhs->_M_data;
  piVar4 = (this->replaced_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  for (lVar9 = (long)iVar10; 0 < lVar9; lVar9 = lVar9 + -1) {
    pdVar5[piVar4[lVar9 + -1]] = pdVar5[(long)iVar2 + lVar9 + -1];
    pdVar5[(long)iVar2 + lVar9 + -1] = 0.0;
  }
  return;
}

Assistant:

void ForrestTomlin::SolvePermuted(Vector& lhs, char trans) {
    Int num_updates = replaced_.size();
    assert(U_.cols() == dim_+num_updates);

    // Require num_updates elements workspace at end of lhs.
    assert((Int)lhs.size() >= dim_+num_updates);

    if (trans == 't' || trans == 'T') {
        // Move replaced entries to the end of the pivot sequence and zero out
        // their old position. Because the corresponding columns of U are unit
        // columns now, the replaced positions remain zero when solving with U'.
        // This is crucial because we neglected to zero out the corresponding
        // rows of U in the update, so there are entries in U which actually
        // should not be there.
        for (Int k = 0; k < num_updates; k++) {
            lhs[dim_+k] = lhs[replaced_[k]];
            lhs[replaced_[k]] = 0.0;
        }
        TriangularSolve(U_, lhs, 't', "upper", 0);
        // Solve backwards with row eta matrices (leading scatter operations)
        // and put the entry from the end of the pivot sequence back into the
        // position that its update replaced.
        for (Int k = num_updates-1; k >= 0; k--) {
            ScatterColumn(R_, k, -lhs[dim_+k], lhs);
            lhs[replaced_[k]] = lhs[dim_+k];
            lhs[dim_+k] = 0.0;
        }
        TriangularSolve(L_, lhs, 't', "lower", 1);
    }
    else {
        TriangularSolve(L_, lhs, 'n', "lower", 1);
        // Solve forward with row eta matrices (leading gather operations) and
        // put the newly computed entry at the end of the pivot sequence. We
        // actually would not need to zero out the replaced positions here
        // because they will not be accessed by any subsequent eta matrix.
        for (Int k = 0; k < num_updates; k++) {
            lhs[dim_+k] = lhs[replaced_[k]] - DotColumn(R_, k, lhs);
            lhs[replaced_[k]] = 0.0;
        }
        // The triangular solve with U fills the replaced position with garbage.
        // This does not hurt because by the fact that the corresponding columns
        // of U have no nonzero off-diagonal entries, the computed values are
        // not propagated further. We finally overwrite them with their actual
        // values from the end of the pivot sequence.
        TriangularSolve(U_, lhs, 'n', "upper", 0);
        for (Int k = num_updates-1; k >= 0; k--) {
            lhs[replaced_[k]] = lhs[dim_+k];
            lhs[dim_+k] = 0.0;
        }
    }
}